

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *
co_await<kj::HttpServer::Connection::LoopResult>
          (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *__return_storage_ptr__,
          Promise<kj::HttpServer::Connection::LoopResult> *promise)

{
  PromiseBase local_10;
  
  local_10.node.ptr = (OwnPromiseNode)(promise->super_PromiseBase).node.ptr;
  (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::PromiseAwaiter
            (__return_storage_ptr__,&local_10.node);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_10.node);
  return __return_storage_ptr__;
}

Assistant:

_::PromiseAwaiter<T> operator co_await(Promise<T>& promise) {
  return _::PromiseAwaiter<T>(_::PromiseNode::from(kj::mv(promise)));
}